

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<boost::detail::thread_data_base>::reset<boost::detail::thread_data_base>
          (shared_ptr<boost::detail::thread_data_base> *this,thread_data_base *p)

{
  element_type *in_RSI;
  shared_ptr<boost::detail::thread_data_base> *in_RDI;
  bool bVar1;
  shared_ptr<boost::detail::thread_data_base> *in_stack_ffffffffffffffc8;
  thread_data_base *in_stack_ffffffffffffffe8;
  
  bVar1 = true;
  if (in_RSI != (element_type *)0x0) {
    bVar1 = in_RSI != in_RDI->px;
  }
  if (!bVar1) {
    __assert_fail("p == 0 || p != px",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                  ,0x2ba,
                  "void boost::shared_ptr<boost::detail::thread_data_base>::reset(Y *) [T = boost::detail::thread_data_base, Y = boost::detail::thread_data_base]"
                 );
  }
  shared_ptr<boost::detail::thread_data_base>
            ((shared_ptr<boost::detail::thread_data_base> *)in_RSI,in_stack_ffffffffffffffe8);
  swap(in_RDI,in_stack_ffffffffffffffc8);
  ~shared_ptr((shared_ptr<boost::detail::thread_data_base> *)0x2a53cd);
  return;
}

Assistant:

void reset( Y * p ) // Y must be complete
    {
        BOOST_ASSERT( p == 0 || p != px ); // catch self-reset errors
        this_type( p ).swap( *this );
    }